

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.cpp
# Opt level: O1

int mbedtls_gcm_finish(mbedtls_gcm_context *ctx,uchar *output,size_t output_size,
                      size_t *output_length,uchar *tag,size_t tag_len)

{
  uchar *x;
  uint64_t uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  
  *output_length = 0;
  uVar1 = ctx->len;
  uVar6 = ctx->add_len;
  if ((uVar6 & 0xf) != 0 && uVar1 == 0) {
    gcm_mult(ctx,ctx->buf,ctx->buf);
  }
  iVar3 = -0x14;
  if (0xfffffffffffffff2 < tag_len - 0x11) {
    lVar11 = uVar1 << 3;
    lVar9 = uVar6 << 3;
    if ((ctx->len & 0xf) != 0) {
      gcm_mult(ctx,ctx->buf,ctx->buf);
    }
    switchD_012e1ce8::default(tag,ctx->base_ectr,tag_len);
    iVar3 = 0;
    if (lVar11 != 0 || lVar9 != 0) {
      uVar2 = (uint)((ulong)lVar9 >> 0x20);
      uVar8 = (uint)lVar9;
      uVar4 = (uint)((ulong)lVar11 >> 0x20);
      uVar10 = (uint)lVar11;
      x = ctx->buf;
      uVar6 = *(ulong *)(ctx->buf + 8);
      *(ulong *)ctx->buf =
           *(ulong *)ctx->buf ^
           CONCAT44(uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18,
                    uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18)
      ;
      *(ulong *)(ctx->buf + 8) =
           uVar6 ^ CONCAT44(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                            uVar10 << 0x18,
                            uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                            uVar4 << 0x18);
      gcm_mult(ctx,x,x);
      if (tag_len < 8) {
        uVar5 = 0;
      }
      else {
        uVar6 = 0;
        do {
          *(ulong *)(tag + uVar6) = *(ulong *)(tag + uVar6) ^ *(ulong *)(x + uVar6);
          uVar5 = uVar6 + 8;
          uVar7 = uVar6 + 0x10;
          uVar6 = uVar5;
        } while (uVar7 <= tag_len);
      }
      iVar3 = 0;
      if (uVar5 < tag_len) {
        do {
          tag[uVar5] = tag[uVar5] ^ x[uVar5];
          uVar5 = uVar5 + 1;
          iVar3 = 0;
        } while (tag_len != uVar5);
      }
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_gcm_finish(mbedtls_gcm_context *ctx,
                       unsigned char *output, size_t output_size,
                       size_t *output_length,
                       unsigned char *tag, size_t tag_len)
{
    unsigned char work_buf[16];
    uint64_t orig_len;
    uint64_t orig_add_len;

    /* We never pass any output in finish(). The output parameter exists only
     * for the sake of alternative implementations. */
    (void) output;
    (void) output_size;
    *output_length = 0;

    /* Total length is restricted to 2^39 - 256 bits, ie 2^36 - 2^5 bytes
     * and AD length is restricted to 2^64 bits, ie 2^61 bytes so neither of
     * the two multiplications would overflow. */
    orig_len = ctx->len * 8;
    orig_add_len = ctx->add_len * 8;

    if (ctx->len == 0 && ctx->add_len % 16 != 0) {
        gcm_mult(ctx, ctx->buf, ctx->buf);
    }

    if (tag_len > 16 || tag_len < 4) {
        return MBEDTLS_ERR_GCM_BAD_INPUT;
    }

    if (ctx->len % 16 != 0) {
        gcm_mult(ctx, ctx->buf, ctx->buf);
    }

    memcpy(tag, ctx->base_ectr, tag_len);

    if (orig_len || orig_add_len) {
        memset(work_buf, 0x00, 16);

        MBEDTLS_PUT_UINT32_BE((orig_add_len >> 32), work_buf, 0);
        MBEDTLS_PUT_UINT32_BE((orig_add_len), work_buf, 4);
        MBEDTLS_PUT_UINT32_BE((orig_len     >> 32), work_buf, 8);
        MBEDTLS_PUT_UINT32_BE((orig_len), work_buf, 12);

        mbedtls_xor(ctx->buf, ctx->buf, work_buf, 16);

        gcm_mult(ctx, ctx->buf, ctx->buf);

        mbedtls_xor(tag, tag, ctx->buf, tag_len);
    }

    return 0;
}